

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O1

void ipc_pipe_recv_cancel(nni_aio *aio,void *arg,int rv)

{
  nni_mtx *mtx;
  int iVar1;
  nni_aio *pnVar2;
  
  mtx = (nni_mtx *)((long)arg + 0x608);
  nni_mtx_lock(mtx);
  iVar1 = nni_aio_list_active(aio);
  if (iVar1 != 0) {
    pnVar2 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x78));
    if (pnVar2 != aio) {
      nni_aio_list_remove(aio);
      nni_mtx_unlock(mtx);
      nni_aio_finish_error(aio,rv);
      return;
    }
    nni_aio_abort((nni_aio *)((long)arg + 0x270),rv);
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
ipc_pipe_recv_cancel(nni_aio *aio, void *arg, int rv)
{
	ipc_pipe *p = arg;

	nni_mtx_lock(&p->mtx);
	if (!nni_aio_list_active(aio)) {
		nni_mtx_unlock(&p->mtx);
		return;
	}
	// If receive in progress, then cancel the pending transfer.
	// The callback on the rx_aio will cause the user aio to
	// be canceled too.
	if (nni_list_first(&p->recv_q) == aio) {
		nni_aio_abort(&p->rx_aio, rv);
		nni_mtx_unlock(&p->mtx);
		return;
	}
	nni_aio_list_remove(aio);
	nni_mtx_unlock(&p->mtx);
	nni_aio_finish_error(aio, rv);
}